

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vault.c
# Opt level: O3

char vault_occupied(char *array)

{
  char cVar1;
  char *ptr;
  char *pcVar2;
  
  cVar1 = *array;
  if (cVar1 != '\0') {
    pcVar2 = array + 1;
    do {
      if (*(char *)((long)level->monsters + (long)cVar1 * 0xd8 + 0x335c) == '\x04') {
        return cVar1;
      }
      cVar1 = *pcVar2;
      pcVar2 = pcVar2 + 1;
    } while (cVar1 != '\0');
  }
  return '\0';
}

Assistant:

char vault_occupied(char *array)
{
	char *ptr;

	for (ptr = array; *ptr; ptr++)
		if (level->rooms[*ptr - ROOMOFFSET].rtype == VAULT)
			return *ptr;
	return '\0';
}